

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

int __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  MatrixOp op_00;
  InputType inputType_;
  DataType dataType;
  Precision precision_00;
  TestContext *pTVar2;
  undefined8 __s;
  bool bVar3;
  int vecSize;
  int vecSize_00;
  DataType DVar4;
  TestNode *node;
  char *__rhs;
  char *pcVar5;
  ShaderMatrixCase *pSVar6;
  ShaderMatrixTests *pSVar7;
  InputTypeSpec *pIVar8;
  InputType local_d40;
  InputType local_c68;
  InputType local_bf8;
  InputType local_b78;
  allocator<char> local_9d9;
  string local_9d8;
  allocator<char> local_9b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  string local_990;
  undefined1 local_96a;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  string local_920;
  undefined1 local_900 [8];
  ShaderInput otherMatIn_2;
  allocator<char> local_8c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  string local_8a8;
  undefined1 local_882;
  allocator<char> local_881;
  string local_880;
  allocator<char> local_859;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  string local_838;
  undefined1 local_818 [8];
  ShaderInput voidInput;
  allocator<char> local_7e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  string local_7c0;
  undefined1 local_79a;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  string local_750;
  undefined1 local_72c [8];
  ShaderInput vec2In;
  ShaderInput vec1In;
  allocator<char> local_6e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  string local_6a8;
  undefined1 local_682;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  string local_618;
  undefined1 local_5f8 [8];
  ShaderInput otherMatIn_1;
  allocator<char> local_5c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  string local_580;
  undefined1 local_55a;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  string local_4f0;
  undefined1 local_4cc [8];
  ShaderInput otherMatIn;
  int otherCols;
  allocator<char> local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  string local_470;
  undefined1 local_44a;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400;
  allocator<char> local_3d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [8];
  string vecMatName;
  ShaderInput rowVecIn;
  DataType rowVecType;
  allocator<char> local_2f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  undefined1 local_292;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  undefined1 local_204 [8];
  ShaderInput colVecIn;
  DataType colVecType;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  undefined1 local_182;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  undefined1 local_114 [8];
  ShaderInput scalarIn;
  ShaderInput matIn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string baseName;
  char *precName;
  Precision precision;
  int precNdx;
  char *matTypeName;
  int numRows;
  int numCols;
  DataType matType;
  int matTypeNdx;
  TestCaseGroup *inGroup;
  int local_40;
  InputType inputType;
  int inTypeNdx;
  TestCaseGroup *opGroup;
  MatrixOp op;
  int inTypeListSize;
  InputTypeSpec *inTypeList;
  int opNdx;
  ShaderMatrixTests *this_local;
  
  inTypeList._4_4_ = 0;
  pSVar7 = this;
  while ((int)inTypeList._4_4_ < 0x13) {
    pIVar8 = init::reducedInputTypes;
    if ((init::ops[(int)inTypeList._4_4_].extendedInputTypeCases & 1U) != 0) {
      pIVar8 = init::extendedInputTypes;
    }
    bVar1 = init::ops[(int)inTypeList._4_4_].extendedInputTypeCases;
    op_00 = init::ops[(int)inTypeList._4_4_].op;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               init::ops[(int)inTypeList._4_4_].name,init::ops[(int)inTypeList._4_4_].desc);
    tcu::TestNode::addChild((TestNode *)this,node);
    for (local_40 = 0; local_40 < (int)((bVar1 & 1) * 2 + 1); local_40 = local_40 + 1) {
      inputType_ = pIVar8[local_40].type;
      _matType = node;
      if ((init::ops[(int)inTypeList._4_4_].createInputTypeGroup & 1U) != 0) {
        _matType = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)_matType,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                   pIVar8[local_40].name,pIVar8[local_40].desc);
        tcu::TestNode::addChild(node,_matType);
      }
      for (numCols = 0; numCols < 9; numCols = numCols + 1) {
        dataType = init::matrixTypes[numCols];
        vecSize = glu::getDataTypeMatrixNumColumns(dataType);
        vecSize_00 = glu::getDataTypeMatrixNumRows(dataType);
        __rhs = glu::getDataTypeName(dataType);
        for (precName._4_4_ = 0; precName._4_4_ < 2; precName._4_4_ = precName._4_4_ + 1) {
          precision_00 = init::precisions[precName._4_4_];
          pcVar5 = glu::getPrecisionName(precision_00);
          baseName.field_2._8_8_ = pcVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&matIn.precision,pcVar5,
                     (allocator<char> *)((long)&matIn.dataType + 3));
          std::operator+(&local_d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &matIn.precision,"_");
          std::operator+(&local_b8,&local_d8,__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,&local_b8,"_");
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&matIn.precision);
          std::allocator<char>::~allocator((allocator<char> *)((long)&matIn.dataType + 3));
          MatrixCaseUtils::ShaderInput::ShaderInput
                    ((ShaderInput *)&scalarIn.dataType,inputType_,dataType,precision_00);
          bVar3 = MatrixCaseUtils::isOperationMatrixScalar(op_00);
          if (bVar3) {
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_114,(op_00 != OP_DIV) + INPUTTYPE_UNIFORM,TYPE_FLOAT,
                       precision_00);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            local_182 = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_158,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_138,pcVar5,&local_159);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,"Matrix-scalar case",&local_181);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_138,&local_180,(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_114,op_00,true);
            local_182 = 0;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_180);
            std::allocator<char>::~allocator(&local_181);
            std::__cxx11::string::~string((string *)&local_138);
            std::allocator<char>::~allocator(&local_159);
            std::__cxx11::string::~string((string *)&local_158);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            colVecIn.precision._2_1_ = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_1c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a8,pcVar5,&local_1c9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&colVecType,"Matrix-scalar case",
                       (allocator<char> *)((long)&colVecIn.precision + 3));
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_1a8,(string *)&colVecType,
                       (ShaderInput *)&scalarIn.dataType,(ShaderInput *)local_114,op_00,false);
            colVecIn.precision._2_1_ = PRECISION_LOWP >> 0x10;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&colVecType);
            std::allocator<char>::~allocator((allocator<char> *)((long)&colVecIn.precision + 3));
            std::__cxx11::string::~string((string *)&local_1a8);
            std::allocator<char>::~allocator(&local_1c9);
            std::__cxx11::string::~string((string *)&local_1c8);
          }
          bVar3 = MatrixCaseUtils::isOperationMatrixVector(op_00);
          if (bVar3) {
            colVecIn.dataType = glu::getDataTypeFloatVec(vecSize);
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_204,(op_00 != OP_DIV) + INPUTTYPE_UNIFORM,
                       colVecIn.dataType,precision_00);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            local_292 = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            pcVar5 = glu::getDataTypeName(colVecIn.dataType);
            std::operator+(&local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,pcVar5);
            std::operator+(&local_248,&local_268,"_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_228,pcVar5,&local_269);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_290,"Matrix-vector case",&local_291);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_228,&local_290,(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_204,op_00,true);
            local_292 = 0;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_290);
            std::allocator<char>::~allocator(&local_291);
            std::__cxx11::string::~string((string *)&local_228);
            std::allocator<char>::~allocator(&local_269);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_268);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            rowVecIn.precision._2_1_ = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            pcVar5 = glu::getDataTypeName(colVecIn.dataType);
            std::operator+(&local_2f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,pcVar5);
            std::operator+(&local_2d8,&local_2f8,"_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b8,pcVar5,&local_2f9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rowVecType,"Matrix-vector case",
                       (allocator<char> *)((long)&rowVecIn.precision + 3));
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_2b8,(string *)&rowVecType,
                       (ShaderInput *)&scalarIn.dataType,(ShaderInput *)local_204,op_00,false);
            rowVecIn.precision._2_1_ = PRECISION_LOWP >> 0x10;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&rowVecType);
            std::allocator<char>::~allocator((allocator<char> *)((long)&rowVecIn.precision + 3));
            std::__cxx11::string::~string((string *)&local_2b8);
            std::allocator<char>::~allocator(&local_2f9);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_2f8);
            rowVecIn.dataType = glu::getDataTypeFloatVec(vecSize_00);
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)((long)&vecMatName.field_2 + 0xc),
                       (op_00 != OP_DIV) + INPUTTYPE_UNIFORM,rowVecIn.dataType,precision_00);
            __s = baseName.field_2._8_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d8,(char *)__s,&local_3d9);
            std::operator+(&local_3b8,&local_3d8,"_");
            pcVar5 = glu::getDataTypeName(rowVecIn.dataType);
            std::operator+(&local_398,&local_3b8,pcVar5);
            std::operator+(&local_378,&local_398,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,&local_378,__rhs);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&local_3b8);
            std::__cxx11::string::~string((string *)&local_3d8);
            std::allocator<char>::~allocator(&local_3d9);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            local_44a = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_420,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,"_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_400,pcVar5,&local_421);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_448,"Vector-matrix case",&local_449);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_400,&local_448,
                       (ShaderInput *)((long)&vecMatName.field_2 + 0xc),
                       (ShaderInput *)&scalarIn.dataType,op_00,true);
            local_44a = 0;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_448);
            std::allocator<char>::~allocator(&local_449);
            std::__cxx11::string::~string((string *)&local_400);
            std::allocator<char>::~allocator(&local_421);
            std::__cxx11::string::~string((string *)&local_420);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            otherMatIn.precision._2_1_ = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_490,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,"_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_470,pcVar5,&local_491);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&otherCols,"Vector-matrix case",
                       (allocator<char> *)((long)&otherMatIn.precision + 3));
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_470,(string *)&otherCols,
                       (ShaderInput *)((long)&vecMatName.field_2 + 0xc),
                       (ShaderInput *)&scalarIn.dataType,op_00,false);
            otherMatIn.precision._2_1_ = PRECISION_LOWP >> 0x10;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&otherCols);
            std::allocator<char>::~allocator((allocator<char> *)((long)&otherMatIn.precision + 3));
            std::__cxx11::string::~string((string *)&local_470);
            std::allocator<char>::~allocator(&local_491);
            std::__cxx11::string::~string((string *)&local_490);
            std::__cxx11::string::~string((string *)local_358);
          }
          bVar3 = MatrixCaseUtils::isOperationArithmeticMatrixMatrix(op_00);
          if (bVar3) {
            for (otherMatIn.dataType = TYPE_FLOAT_VEC2; (int)otherMatIn.dataType < 5;
                otherMatIn.dataType = otherMatIn.dataType + TYPE_FLOAT) {
              local_b78 = inputType_;
              if (inputType_ == INPUTTYPE_DYNAMIC) {
                local_b78 = INPUTTYPE_UNIFORM;
              }
              DVar4 = glu::getDataTypeMatrix(otherMatIn.dataType,vecSize);
              MatrixCaseUtils::ShaderInput::ShaderInput
                        ((ShaderInput *)local_4cc,local_b78,DVar4,precision_00);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
              local_55a = 1;
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              pcVar5 = glu::getDataTypeName(local_4cc._4_4_);
              std::operator+(&local_530,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98,pcVar5);
              std::operator+(&local_510,&local_530,"_vertex");
              pcVar5 = (char *)std::__cxx11::string::c_str();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4f0,pcVar5,&local_531);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_558,"Matrix-matrix case",&local_559);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pTVar2,&local_4f0,&local_558,(ShaderInput *)&scalarIn.dataType,
                         (ShaderInput *)local_4cc,op_00,true);
              local_55a = 0;
              tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
              std::__cxx11::string::~string((string *)&local_558);
              std::allocator<char>::~allocator(&local_559);
              std::__cxx11::string::~string((string *)&local_4f0);
              std::allocator<char>::~allocator(&local_531);
              std::__cxx11::string::~string((string *)&local_510);
              std::__cxx11::string::~string((string *)&local_530);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
              otherMatIn_1.dataType._2_1_ = 1;
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              pcVar5 = glu::getDataTypeName(local_4cc._4_4_);
              std::operator+(&local_5c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98,pcVar5);
              std::operator+(&local_5a0,&local_5c0,"_fragment");
              pcVar5 = (char *)std::__cxx11::string::c_str();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_580,pcVar5,&local_5c1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&otherMatIn_1.precision,"Matrix-matrix case",
                         (allocator<char> *)((long)&otherMatIn_1.dataType + 3));
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pTVar2,&local_580,(string *)&otherMatIn_1.precision,
                         (ShaderInput *)&scalarIn.dataType,(ShaderInput *)local_4cc,op_00,false);
              otherMatIn_1.dataType._2_1_ = TYPE_INVALID >> 0x10;
              tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
              std::__cxx11::string::~string((string *)&otherMatIn_1.precision);
              std::allocator<char>::~allocator
                        ((allocator<char> *)((long)&otherMatIn_1.dataType + 3));
              std::__cxx11::string::~string((string *)&local_580);
              std::allocator<char>::~allocator(&local_5c1);
              std::__cxx11::string::~string((string *)&local_5a0);
              std::__cxx11::string::~string((string *)&local_5c0);
            }
          }
          else {
            bVar3 = MatrixCaseUtils::isOperationComponentwiseMatrixMatrix(op_00);
            if (bVar3) {
              local_bf8 = inputType_;
              if (inputType_ == INPUTTYPE_DYNAMIC) {
                local_bf8 = INPUTTYPE_UNIFORM;
              }
              MatrixCaseUtils::ShaderInput::ShaderInput
                        ((ShaderInput *)local_5f8,local_bf8,dataType,precision_00);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
              local_682 = 1;
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              std::operator+(&local_658,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98,__rhs);
              std::operator+(&local_638,&local_658,"_vertex");
              pcVar5 = (char *)std::__cxx11::string::c_str();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_618,pcVar5,&local_659);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_680,"Matrix-matrix case",&local_681);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pTVar2,&local_618,&local_680,(ShaderInput *)&scalarIn.dataType,
                         (ShaderInput *)local_5f8,op_00,true);
              local_682 = 0;
              tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
              std::__cxx11::string::~string((string *)&local_680);
              std::allocator<char>::~allocator(&local_681);
              std::__cxx11::string::~string((string *)&local_618);
              std::allocator<char>::~allocator(&local_659);
              std::__cxx11::string::~string((string *)&local_638);
              std::__cxx11::string::~string((string *)&local_658);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
              vec1In.dataType._2_1_ = 1;
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              std::operator+(&local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98,__rhs);
              std::operator+(&local_6c8,&local_6e8,"_fragment");
              pcVar5 = (char *)std::__cxx11::string::c_str();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_6a8,pcVar5,&local_6e9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vec1In.precision,"Matrix-matrix case",
                         (allocator<char> *)((long)&vec1In.dataType + 3));
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pTVar2,&local_6a8,(string *)&vec1In.precision,
                         (ShaderInput *)&scalarIn.dataType,(ShaderInput *)local_5f8,op_00,false);
              vec1In.dataType._2_1_ = TYPE_INVALID >> 0x10;
              tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
              std::__cxx11::string::~string((string *)&vec1In.precision);
              std::allocator<char>::~allocator((allocator<char> *)((long)&vec1In.dataType + 3));
              std::__cxx11::string::~string((string *)&local_6a8);
              std::allocator<char>::~allocator(&local_6e9);
              std::__cxx11::string::~string((string *)&local_6c8);
              std::__cxx11::string::~string((string *)&local_6e8);
            }
          }
          bVar3 = MatrixCaseUtils::isOperationVectorVector(op_00);
          if (bVar3) {
            DVar4 = glu::getDataTypeFloatVec(vecSize_00);
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)&vec2In.dataType,inputType_,DVar4,precision_00);
            local_c68 = inputType_;
            if (inputType_ == INPUTTYPE_DYNAMIC) {
              local_c68 = INPUTTYPE_UNIFORM;
            }
            DVar4 = glu::getDataTypeFloatVec(vecSize);
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_72c,local_c68,DVar4,precision_00);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            local_79a = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_770,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_750,pcVar5,&local_771);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_798,"Vector-vector case",&local_799);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_750,&local_798,(ShaderInput *)&vec2In.dataType,
                       (ShaderInput *)local_72c,op_00,true);
            local_79a = 0;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_798);
            std::allocator<char>::~allocator(&local_799);
            std::__cxx11::string::~string((string *)&local_750);
            std::allocator<char>::~allocator(&local_771);
            std::__cxx11::string::~string((string *)&local_770);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            voidInput.dataType._2_1_ = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_7e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7c0,pcVar5,&local_7e1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&voidInput.precision,"Vector-vector case",
                       (allocator<char> *)((long)&voidInput.dataType + 3));
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_7c0,(string *)&voidInput.precision,
                       (ShaderInput *)&vec2In.dataType,(ShaderInput *)local_72c,op_00,false);
            voidInput.dataType._2_1_ = TYPE_INVALID >> 0x10;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&voidInput.precision);
            std::allocator<char>::~allocator((allocator<char> *)((long)&voidInput.dataType + 3));
            std::__cxx11::string::~string((string *)&local_7c0);
            std::allocator<char>::~allocator(&local_7e1);
            std::__cxx11::string::~string((string *)&local_7e0);
          }
          bVar3 = MatrixCaseUtils::isOperationUnaryAnyMatrix(op_00);
          if ((bVar3) ||
             ((bVar3 = MatrixCaseUtils::isOperationUnarySymmetricMatrix(op_00), bVar3 &&
              (vecSize == vecSize_00)))) {
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_818,INPUTTYPE_LAST,TYPE_LAST,PRECISION_LAST);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            local_882 = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_858,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_838,pcVar5,&local_859);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_880,"Matrix case",&local_881);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_838,&local_880,(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_818,op_00,true);
            local_882 = 0;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_880);
            std::allocator<char>::~allocator(&local_881);
            std::__cxx11::string::~string((string *)&local_838);
            std::allocator<char>::~allocator(&local_859);
            std::__cxx11::string::~string((string *)&local_858);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            otherMatIn_2.dataType._2_1_ = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_8c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_8a8,pcVar5,&local_8c9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&otherMatIn_2.precision,"Matrix case",
                       (allocator<char> *)((long)&otherMatIn_2.dataType + 3));
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_8a8,(string *)&otherMatIn_2.precision,
                       (ShaderInput *)&scalarIn.dataType,(ShaderInput *)local_818,op_00,false);
            otherMatIn_2.dataType._2_1_ = TYPE_INVALID >> 0x10;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&otherMatIn_2.precision);
            std::allocator<char>::~allocator((allocator<char> *)((long)&otherMatIn_2.dataType + 3));
            std::__cxx11::string::~string((string *)&local_8a8);
            std::allocator<char>::~allocator(&local_8c9);
            std::__cxx11::string::~string((string *)&local_8c8);
          }
          bVar3 = MatrixCaseUtils::isOperationAssignmentAnyMatrix(op_00);
          if ((bVar3) ||
             ((bVar3 = MatrixCaseUtils::isOperationAssignmentSymmetricMatrix(op_00), bVar3 &&
              (vecSize == vecSize_00)))) {
            local_d40 = inputType_;
            if (inputType_ == INPUTTYPE_DYNAMIC) {
              local_d40 = INPUTTYPE_UNIFORM;
            }
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_900,local_d40,dataType,precision_00);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            local_96a = 1;
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_940,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_920,pcVar5,&local_941);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_968,"Matrix assignment case",&local_969);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_920,&local_968,(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_900,op_00,true);
            local_96a = 0;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_968);
            std::allocator<char>::~allocator(&local_969);
            std::__cxx11::string::~string((string *)&local_920);
            std::allocator<char>::~allocator(&local_941);
            std::__cxx11::string::~string((string *)&local_940);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_9b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_990,pcVar5,&local_9b1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_9d8,"Matrix assignment case",&local_9d9);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pTVar2,&local_990,&local_9d8,(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_900,op_00,false);
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_9d8);
            std::allocator<char>::~allocator(&local_9d9);
            std::__cxx11::string::~string((string *)&local_990);
            std::allocator<char>::~allocator(&local_9b1);
            std::__cxx11::string::~string((string *)&local_9b0);
          }
          std::__cxx11::string::~string((string *)local_98);
        }
      }
    }
    inTypeList._4_4_ = inTypeList._4_4_ + 1;
    pSVar7 = (ShaderMatrixTests *)(ulong)inTypeList._4_4_;
  }
  return (int)pSVar7;
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		const MatrixOp	op;
		const bool		extendedInputTypeCases; // !< test with const and uniform types too
		const bool		createInputTypeGroup;	// !< create group for input types
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true,	true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true,	true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true,	true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true,	true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false,	true	},
		{ "outerproduct",	"Matrix outerProduct() tests",					OP_OUTER_PRODUCT,	false,	true	},
		{ "transpose",		"Matrix transpose() tests",						OP_TRANSPOSE,		false,	true	},
		{ "determinant",	"Matrix determinant() tests",					OP_DETERMINANT,		false,	true	},
		{ "inverse",		"Matrix inverse() tests",						OP_INVERSE,			false,	true	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false,	false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false,	false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false,	false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false,	false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		const InputType	type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;
			tcu::TestCaseGroup* inGroup;

			if (ops[opNdx].createInputTypeGroup)
			{
				inGroup = new tcu::TestCaseGroup(m_testCtx, inTypeList[inTypeNdx].name, inTypeList[inTypeNdx].desc);
				opGroup->addChild(inGroup);
			}
			else
				inGroup = opGroup;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				int			numCols		= getDataTypeMatrixNumColumns(matType);
				int			numRows		= getDataTypeMatrixNumRows(matType);
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(precName) + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	colVecType	= getDataTypeFloatVec(numCols);
						ShaderInput colVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, colVecType, precision);

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(colVecType) + "_vertex").c_str(),		"Matrix-vector case", matIn, colVecIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(colVecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, colVecIn, op, false));

						// Vector-matrix.
						DataType	rowVecType	= getDataTypeFloatVec(numRows);
						ShaderInput	rowVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, rowVecType, precision);
						string		vecMatName	= string(precName) + "_" + getDataTypeName(rowVecType) + "_" + matTypeName;

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", rowVecIn, matIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", rowVecIn, matIn, op, false));
					}

					if (isOperationArithmeticMatrixMatrix(op))
					{
						// Arithmetic matrix-matrix multiplication.
						for (int otherCols = 2; otherCols <= 4; otherCols++)
						{
							ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, getDataTypeMatrix(otherCols, numCols /* rows */), precision);
							inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(otherMatIn.dataType) + "_vertex").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, true));
							inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(otherMatIn.dataType) + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
						}
					}
					else if (isOperationComponentwiseMatrixMatrix(op))
					{
						// Component-wise.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationVectorVector(op))
					{
						ShaderInput vec1In(inputType,																getDataTypeFloatVec(numRows), precision);
						ShaderInput vec2In((inputType == INPUTTYPE_DYNAMIC) ? (INPUTTYPE_UNIFORM) : (inputType),	getDataTypeFloatVec(numCols), precision);

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Vector-vector case", vec1In, vec2In, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Vector-vector case", vec1In, vec2In, op, false));
					}

					if ((isOperationUnaryAnyMatrix(op)) ||
						(isOperationUnarySymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if ((isOperationAssignmentAnyMatrix(op)) ||
						(isOperationAssignmentSymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}